

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::AsyncWriteDataCleanup_EveryoneWrites(BP5Writer *this)

{
  TokenChain<unsigned_long> *this_00;
  AsyncWriteInfo *this_01;
  
  this_01 = this->m_AsyncWriteInfo;
  this_00 = this_01->tokenChain;
  if (this_00 != (TokenChain<unsigned_long> *)0x0) {
    shm::TokenChain<unsigned_long>::~TokenChain(this_00);
    operator_delete(this_00);
    this_01 = this->m_AsyncWriteInfo;
    if (this_01 == (AsyncWriteInfo *)0x0) {
      this_01 = (AsyncWriteInfo *)0x0;
      goto LAB_004cdeb5;
    }
  }
  AsyncWriteInfo::~AsyncWriteInfo(this_01);
LAB_004cdeb5:
  operator_delete(this_01);
  this->m_AsyncWriteInfo = (AsyncWriteInfo *)0x0;
  return;
}

Assistant:

void BP5Writer::AsyncWriteDataCleanup_EveryoneWrites()
{
    if (m_AsyncWriteInfo->tokenChain)
    {
        delete m_AsyncWriteInfo->tokenChain;
    }
    delete m_AsyncWriteInfo;
    m_AsyncWriteInfo = nullptr;
}